

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O2

ImPlotPoint __thiscall
ImPlot::GetterXsYs<unsigned_short>::operator()(GetterXsYs<unsigned_short> *this,int idx)

{
  int iVar1;
  long lVar2;
  ImPlotPoint IVar3;
  
  iVar1 = this->Count;
  lVar2 = (long)(((idx + this->Offset) % iVar1 + iVar1) % iVar1) * (long)this->Stride;
  IVar3.x = (double)*(ushort *)((long)this->Xs + lVar2);
  IVar3.y = (double)*(ushort *)((long)this->Ys + lVar2);
  return IVar3;
}

Assistant:

inline ImPlotPoint operator()(int idx) const {
        return ImPlotPoint((double)OffsetAndStride(Xs, idx, Count, Offset, Stride), (double)OffsetAndStride(Ys, idx, Count, Offset, Stride));
    }